

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

bool __thiscall HighsLp::needsMods(HighsLp *this,double infinite_cost)

{
  long in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  bool bVar1;
  
  bVar1 = true;
  if ((*(byte *)(in_RDI + 600) & 1) == 0) {
    bVar1 = hasSemiVariables((HighsLp *)CONCAT17(1,in_stack_ffffffffffffffe8));
  }
  return bVar1;
}

Assistant:

bool HighsLp::needsMods(const double infinite_cost) const {
  assert(this->has_infinite_cost_ == this->hasInfiniteCost(infinite_cost));
  return this->has_infinite_cost_ || this->hasSemiVariables();
}